

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  pointer pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  invalid_argument *this_00;
  ulong uVar10;
  uint uVar11;
  char *__assertion;
  uint uVar12;
  pointer pDVar13;
  uint uVar14;
  Dim c;
  Dim r_1;
  Dim r;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  uint local_1e8;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  ulong uStack_1c0;
  undefined4 local_1b8;
  uint local_1a8;
  undefined8 local_1a4;
  undefined8 uStack_19c;
  undefined8 local_194;
  uint local_18c;
  undefined4 local_188;
  
  pDVar13 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)(pDVar13->d + 2);
  uVar6 = *(undefined8 *)(pDVar13->d + 4);
  uVar7 = *(undefined8 *)(pDVar13->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar13->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar6;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar7;
  __return_storage_ptr__->bd = pDVar13->bd;
  uVar9 = (ulong)__return_storage_ptr__->nd;
  if (1 < uVar9) {
    if (__return_storage_ptr__->d[1] != 1) goto LAB_00271f67;
    uVar10 = 1;
    do {
      if ((2 - uVar9) + uVar10 == 1) goto LAB_00271f2b;
      uVar1 = uVar10 + 1;
      lVar2 = uVar10 + 1;
      uVar10 = uVar1;
    } while (__return_storage_ptr__->d[lVar2] == 1);
    if (uVar1 < uVar9) goto LAB_00271f67;
  }
LAB_00271f2b:
  __return_storage_ptr__->nd = 1;
LAB_00271f67:
  pDVar4 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar13 == pDVar4) {
    uVar11 = 0;
  }
  else {
    local_1e0 = xs;
    uVar3 = __return_storage_ptr__->nd;
    uVar12 = __return_storage_ptr__->bd;
    uVar11 = 0;
    do {
      uVar5 = *(undefined8 *)pDVar13->d;
      uStack_200 = *(undefined8 *)(pDVar13->d + 2);
      uStack_1f8 = *(undefined8 *)(pDVar13->d + 4);
      uStack_1f0 = *(ulong *)(pDVar13->d + 6);
      local_1e8 = pDVar13->bd;
      uVar9 = uStack_1f0 >> 0x20;
      if (uVar9 < 2) {
LAB_00271fa5:
        uStack_1f0 = CONCAT44(1,(undefined4)uStack_1f0);
      }
      else {
        local_208._4_4_ = (int)((ulong)uVar5 >> 0x20);
        if (local_208._4_4_ == 1) {
          uVar10 = 1;
          do {
            if ((2 - uVar9) + uVar10 == 1) goto LAB_00271fa5;
            uVar1 = uVar10 + 1;
            lVar2 = uVar10 * 4;
            uVar10 = uVar1;
          } while (*(int *)((long)&local_208 + lVar2 + 4) == 1);
          if (uVar9 <= uVar1) goto LAB_00271fa5;
        }
      }
      uVar14 = 1;
      if (uStack_1f0._4_4_ != 0) {
        local_208._0_4_ = (uint)uVar5;
        uVar14 = (uint)local_208;
      }
      local_208 = uVar5;
      if (uVar3 == 0) goto LAB_00272145;
      if (uVar14 == 0) goto LAB_0027214e;
      __return_storage_ptr__->d[0] = uVar14;
      local_1a8 = __return_storage_ptr__->d[0];
      local_1a4 = *(undefined8 *)(__return_storage_ptr__->d + 1);
      uStack_19c = *(undefined8 *)(__return_storage_ptr__->d + 3);
      local_194 = *(undefined8 *)(__return_storage_ptr__->d + 5);
      local_18c = __return_storage_ptr__->nd;
      local_188 = 1;
      uStack_1c0 = uStack_1f0;
      local_1b8 = 1;
      local_1d8 = uVar5;
      uStack_1d0 = uStack_200;
      uStack_1c8 = uStack_1f8;
      if ((local_18c != uStack_1f0._4_4_) ||
         (iVar8 = bcmp(&local_1a8,&local_1d8,(ulong)local_18c), iVar8 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Bad input dimensions in Concatenate: ",0x25);
        operator<<((ostream *)&local_1a8,local_1e0);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,(string *)&local_1d8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar11 = uVar11 + uVar14;
      if (uVar12 <= local_1e8) {
        uVar12 = local_1e8;
      }
      __return_storage_ptr__->bd = uVar12;
      pDVar13 = pDVar13 + 1;
    } while (pDVar13 != pDVar4);
  }
  if (__return_storage_ptr__->nd == 0) {
LAB_00272145:
    __assertion = "i < nd";
  }
  else {
    if (uVar11 != 0) {
      __return_storage_ptr__->d[0] = uVar11;
      return __return_storage_ptr__;
    }
LAB_0027214e:
    __assertion = "s > 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/dim.h"
                ,0x44,"void cnn::Dim::set(unsigned int, unsigned int)");
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr.single_batch() != c.single_batch()) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}